

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

int If_Dec7PickBestMux(word *t,word *c0r,word *c1r)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  int Count_1;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  int Count;
  uint uVar9;
  int v;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int local_58;
  int local_54;
  
  local_58 = -1;
  local_54 = 1000;
  lVar4 = 0;
  do {
    uVar12 = *t;
    if (lVar4 == 6) {
      uVar7 = t[1];
      uVar13 = uVar7;
      uVar11 = uVar12;
    }
    else {
      uVar7 = Truth6[lVar4];
      uVar2 = uVar12 & ~uVar7;
      bVar3 = (byte)(1 << ((byte)lVar4 & 0x1f));
      uVar11 = ~uVar7 & t[1];
      uVar13 = uVar12 & uVar7;
      uVar12 = uVar2 << (bVar3 & 0x3f) | uVar2;
      uVar7 = t[1] & uVar7;
      uVar11 = uVar11 << (bVar3 & 0x3f) | uVar11;
      uVar13 = uVar13 >> (bVar3 & 0x3f) | uVar13;
      uVar7 = uVar7 >> (bVar3 & 0x3f) | uVar7;
    }
    lVar10 = 0;
    pwVar8 = Truth6;
    uVar9 = 0;
    do {
      uVar2 = uVar11;
      uVar5 = uVar12;
      uVar1 = uVar12;
      uVar14 = uVar11;
      if (lVar10 != 6) {
        uVar14 = *pwVar8;
        uVar5 = uVar12 & ~uVar14;
        bVar3 = (byte)(1 << ((byte)lVar10 & 0x1f));
        uVar5 = uVar5 << (bVar3 & 0x3f) | uVar5;
        uVar1 = ~uVar14 & uVar11;
        uVar1 = uVar1 << (bVar3 & 0x3f) | uVar1;
        uVar2 = (uVar14 & uVar12) >> (bVar3 & 0x3f) | uVar14 & uVar12;
        uVar14 = (uVar14 & uVar11) >> (bVar3 & 0x3f) | uVar14 & uVar11;
      }
      uVar9 = uVar9 + (uVar5 != uVar2 || uVar1 != uVar14);
      lVar10 = lVar10 + 1;
      pwVar8 = pwVar8 + 1;
    } while (lVar10 != 7);
    lVar10 = 0;
    pwVar8 = Truth6;
    uVar6 = 0;
    do {
      uVar2 = uVar7;
      uVar5 = uVar13;
      uVar1 = uVar7;
      uVar14 = uVar13;
      if (lVar10 != 6) {
        uVar2 = *pwVar8;
        uVar5 = uVar13 & ~uVar2;
        bVar3 = (byte)(1 << ((byte)lVar10 & 0x1f));
        uVar5 = uVar5 << (bVar3 & 0x3f) | uVar5;
        uVar14 = ~uVar2 & uVar7;
        uVar14 = uVar14 << (bVar3 & 0x3f) | uVar14;
        uVar1 = (uVar2 & uVar13) >> (bVar3 & 0x3f) | uVar2 & uVar13;
        uVar2 = (uVar2 & uVar7) >> (bVar3 & 0x3f) | uVar2 & uVar7;
      }
      uVar6 = uVar6 + (uVar5 != uVar1 || uVar14 != uVar2);
      lVar10 = lVar10 + 1;
      pwVar8 = pwVar8 + 1;
    } while (lVar10 != 7);
    if (((uVar9 < 5) && (uVar6 < 5)) && ((int)(uVar6 + uVar9) < local_54)) {
      *c0r = uVar12;
      c0r[1] = uVar11;
      *c1r = uVar13;
      c1r[1] = uVar7;
      local_58 = (int)lVar4;
      local_54 = uVar6 + uVar9;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  return local_58;
}

Assistant:

int If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] )
{
    word c0[2], c1[2];
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        Count0 = If_Dec7SuppSize(c0);
        Count1 = If_Dec7SuppSize(c1);
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            c0r[0] = c0[0]; c0r[1] = c0[1];
            c1r[0] = c1[0]; c1r[1] = c1[1];
        }
    }
    return vBest;
}